

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

void __thiscall
OpenMesh::IO::_PLYReader_::readValue(_PLYReader_ *this,ValueType _type,istream *_in,float *_value)

{
  bool _swap;
  ostream *this_00;
  void *this_01;
  float local_2c;
  float *pfStack_28;
  float32_t tmp;
  float *_value_local;
  istream *_in_local;
  _PLYReader_ *p_Stack_10;
  ValueType _type_local;
  _PLYReader_ *this_local;
  
  pfStack_28 = _value;
  _value_local = (float *)_in;
  _in_local._4_4_ = _type;
  p_Stack_10 = this;
  if (_type == ValueTypeFLOAT32 || _type == ValueTypeFLOAT) {
    _swap = Options::check(&this->options_,2);
    restore<float>(_in,&local_2c,_swap);
    *pfStack_28 = local_2c;
  }
  else {
    *_value = 0.0;
    this_00 = std::operator<<((ostream *)&std::cerr,"unsupported conversion type to float: ");
    this_01 = (void *)std::ostream::operator<<(this_00,_in_local._4_4_);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void _PLYReader_::readValue(ValueType _type, std::istream& _in, float& _value) const {

    switch (_type) {
    case ValueTypeFLOAT32:
    case ValueTypeFLOAT:
        float32_t tmp;
        restore(_in, tmp, options_.check(Options::MSB));
        _value = tmp;
        break;
    default:
        _value = 0.0;
        std::cerr << "unsupported conversion type to float: " << _type << std::endl;
        break;
    }
}